

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

string * perfetto::base::ReplaceAll
                   (string *__return_storage_ptr__,string *str,string *to_replace,
                   string *replacement)

{
  uint uVar1;
  code *pcVar2;
  byte bVar3;
  char *fname;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  ulong uVar7;
  string *psVar8;
  size_t pos;
  string *replacement_local;
  string *to_replace_local;
  string *str_local;
  
  bVar3 = ::std::__cxx11::string::empty();
  if ((bVar3 & 1) != 0) {
    fname = Basename(
                    "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                    );
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    LogMessage(kLogError,fname,0x17e5,"%s (errno: %d, %s)","PERFETTO_CHECK(!to_replace.empty())",
               (ulong)uVar1,pcVar6);
    MaybeSerializeLastLogsForCrashReporting();
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  while (uVar7 = ::std::__cxx11::string::find((string *)str,(ulong)to_replace),
        uVar7 != 0xffffffffffffffff) {
    psVar8 = (string *)::std::__cxx11::string::length();
    ::std::__cxx11::string::replace((ulong)str,uVar7,psVar8);
    ::std::__cxx11::string::length();
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string ReplaceAll(std::string str,
                       const std::string& to_replace,
                       const std::string& replacement) {
  PERFETTO_CHECK(!to_replace.empty());
  size_t pos = 0;
  while ((pos = str.find(to_replace, pos)) != std::string::npos) {
    str.replace(pos, to_replace.length(), replacement);
    pos += replacement.length();
  }
  return str;
}